

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# least.cpp
# Opt level: O2

void duckdb::LeastGreatestFunction<long,duckdb::LessThan,duckdb::StandardLeastGreatest<false>>
               (DataChunk *args,ExpressionState *state,Vector *result)

{
  long lVar1;
  reference pvVar2;
  ulong uVar3;
  ulong uVar4;
  idx_t col_idx;
  ulong uVar5;
  long lVar6;
  long lVar7;
  UnifiedVectorFormat vdata;
  long local_878;
  long local_870;
  bool result_has_value [2048];
  
  lVar6 = *(long *)args;
  lVar7 = *(long *)(args + 8);
  if (lVar7 - lVar6 == 0x68) {
    vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,0);
    duckdb::Vector::Reference(result);
    return;
  }
  for (uVar5 = 0; uVar5 < (ulong)((lVar7 - lVar6) / 0x68); uVar5 = uVar5 + 1) {
    vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar5);
    lVar6 = *(long *)args;
    lVar7 = *(long *)(args + 8);
  }
  lVar1 = *(long *)(result + 0x20);
  uVar5 = 0;
  memset(result_has_value,0,0x800);
  do {
    if ((ulong)((lVar7 - lVar6) / 0x68) <= uVar5) {
      StandardLeastGreatest<false>::FinalizeResult
                (*(idx_t *)(args + 0x18),result_has_value,result,state);
      duckdb::Vector::SetVectorType((VectorType)result);
      return;
    }
    pvVar2 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar5);
    if (*pvVar2 == (value_type)0x2) {
      pvVar2 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar5);
      if ((*(byte **)(pvVar2 + 0x28) == (byte *)0x0) || ((**(byte **)(pvVar2 + 0x28) & 1) != 0))
      goto LAB_0070f84f;
    }
    else {
LAB_0070f84f:
      duckdb::UnifiedVectorFormat::UnifiedVectorFormat(&vdata);
      pvVar2 = vector<duckdb::Vector,_true>::get<true>((vector<duckdb::Vector,_true> *)args,uVar5);
      duckdb::Vector::ToUnifiedFormat((ulong)pvVar2,*(UnifiedVectorFormat **)(args + 0x18));
      if (local_870 == 0) {
        for (uVar3 = 0; uVar3 < *(ulong *)(args + 0x18); uVar3 = uVar3 + 1) {
          uVar4 = uVar3;
          if (*_vdata != 0) {
            uVar4 = (ulong)*(uint *)(*_vdata + uVar3 * 4);
          }
          lVar6 = *(long *)(local_878 + uVar4 * 8);
          if ((result_has_value[uVar3] != true) || (lVar6 < *(long *)(lVar1 + uVar3 * 8))) {
            result_has_value[uVar3] = true;
            *(long *)(lVar1 + uVar3 * 8) = lVar6;
          }
        }
      }
      else {
        for (uVar3 = 0; uVar3 < *(ulong *)(args + 0x18); uVar3 = uVar3 + 1) {
          uVar4 = uVar3;
          if (*_vdata != 0) {
            uVar4 = (ulong)*(uint *)(*_vdata + uVar3 * 4);
          }
          if (((*(ulong *)(local_870 + (uVar4 >> 6) * 8) >> (uVar4 & 0x3f) & 1) != 0) &&
             ((lVar6 = *(long *)(local_878 + uVar4 * 8), result_has_value[uVar3] != true ||
              (lVar6 < *(long *)(lVar1 + uVar3 * 8))))) {
            result_has_value[uVar3] = true;
            *(long *)(lVar1 + uVar3 * 8) = lVar6;
          }
        }
      }
      UnifiedVectorFormat::~UnifiedVectorFormat(&vdata);
    }
    uVar5 = uVar5 + 1;
    lVar6 = *(long *)args;
    lVar7 = *(long *)(args + 8);
  } while( true );
}

Assistant:

static void LeastGreatestFunction(DataChunk &args, ExpressionState &state, Vector &result) {
	if (args.ColumnCount() == 1) {
		// single input: nop
		result.Reference(args.data[0]);
		return;
	}
	auto &input = BASE_OP::Prepare(args, state);
	auto &result_vector = BASE_OP::TargetVector(result, state);

	auto result_type = VectorType::CONSTANT_VECTOR;
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (args.data[col_idx].GetVectorType() != VectorType::CONSTANT_VECTOR) {
			// non-constant input: result is not a constant vector
			result_type = VectorType::FLAT_VECTOR;
		}
		if (BASE_OP::IS_STRING) {
			// for string vectors we add a reference to the heap of the children
			StringVector::AddHeapReference(result_vector, input.data[col_idx]);
		}
	}

	auto result_data = FlatVector::GetData<T>(result_vector);
	bool result_has_value[STANDARD_VECTOR_SIZE] {false};
	// perform the operation column-by-column
	for (idx_t col_idx = 0; col_idx < input.ColumnCount(); col_idx++) {
		if (input.data[col_idx].GetVectorType() == VectorType::CONSTANT_VECTOR &&
		    ConstantVector::IsNull(input.data[col_idx])) {
			// ignore null vector
			continue;
		}

		UnifiedVectorFormat vdata;
		input.data[col_idx].ToUnifiedFormat(input.size(), vdata);

		auto input_data = UnifiedVectorFormat::GetData<T>(vdata);
		if (!vdata.validity.AllValid()) {
			// potential new null entries: have to check the null mask
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);
				if (vdata.validity.RowIsValid(vindex)) {
					// not a null entry: perform the operation and add to new set
					auto ivalue = input_data[vindex];
					if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
						result_has_value[i] = true;
						result_data[i] = ivalue;
					}
				}
			}
		} else {
			// no new null entries: only need to perform the operation
			for (idx_t i = 0; i < input.size(); i++) {
				auto vindex = vdata.sel->get_index(i);

				auto ivalue = input_data[vindex];
				if (!result_has_value[i] || OP::template Operation<T>(ivalue, result_data[i])) {
					result_has_value[i] = true;
					result_data[i] = ivalue;
				}
			}
		}
	}
	BASE_OP::FinalizeResult(input.size(), result_has_value, result, state);
	result.SetVectorType(result_type);
}